

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O3

_Bool effect_handler_DETECT_OBJECTS(effect_handler_context_t_conflict *context)

{
  uint32_t *puVar1;
  _Bool _Var2;
  char *fmt;
  
  _Var2 = detect_stuff((effect_handler_context_t_conflict *)(ulong)(uint)context->y,
                       (_func__Bool_object_ptr *)(ulong)(uint)context->x);
  if (_Var2) {
    fmt = "You detect the presence of objects!";
  }
  else {
    if (context->aware != true) goto LAB_0013e57f;
    fmt = "You detect no objects.";
  }
  msg(fmt);
LAB_0013e57f:
  puVar1 = &player->upkeep->redraw;
  *puVar1 = *puVar1 | 0x800000;
  context->ident = true;
  return true;
}

Assistant:

bool effect_handler_DETECT_OBJECTS(effect_handler_context_t *context)
{
	bool objects = detect_stuff(context, tval_is_not_money);

	if (objects) {
		msg("You detect the presence of objects!");
	} else if (context->aware) {
		msg("You detect no objects.");
	}

	/* Redraw object list */
	player->upkeep->redraw |= PR_ITEMLIST;

	context->ident = true;
	return true;
}